

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_reduce.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::ListReduceFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  scalar_function_t *psVar1;
  LogicalType varargs;
  _Any_data *p_Var2;
  long lVar3;
  undefined8 *puVar4;
  ScalarFunctionSet *in_RDI;
  bind_scalar_function_t *pp_Var5;
  byte bVar6;
  initializer_list<duckdb::LogicalType> __l;
  ScalarFunctionSet *set;
  ScalarFunction fun;
  undefined4 in_stack_fffffffffffffb74;
  undefined4 in_stack_fffffffffffffb7c;
  FunctionNullHandling in_stack_fffffffffffffb88;
  bind_lambda_function_t in_stack_fffffffffffffb90;
  scalar_function_t local_460;
  _Any_data *local_440;
  LogicalType local_438;
  LogicalType local_420 [3];
  vector<duckdb::LogicalType,_true> local_3d8;
  LogicalType local_3c0;
  undefined1 local_3a8 [144];
  LogicalType LStack_318;
  FunctionStability local_300;
  FunctionNullHandling FStack_2ff;
  FunctionErrors FStack_2fe;
  FunctionCollationHandling FStack_2fd;
  _Any_data _Stack_2f8;
  _Manager_type local_2e8;
  undefined8 auStack_2d8 [4];
  code *local_2b8;
  code *local_2a0;
  code *local_298;
  element_type *local_290;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  bVar6 = 0;
  LogicalType::LogicalType(&local_438,ANY);
  LogicalType::LIST(local_420,&local_438);
  LogicalType::LogicalType(local_420 + 1,LAMBDA);
  __l._M_len = 2;
  __l._M_array = local_420;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3d8,__l,
             (allocator_type *)&stack0xfffffffffffffb97);
  LogicalType::LogicalType(local_420 + 2,ANY);
  local_460.super__Function_base._M_functor._8_8_ = 0;
  local_460.super__Function_base._M_functor._M_unused._M_function_pointer =
       LambdaFunctions::ListReduceFunction;
  local_460._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_460.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_3c0,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_3c0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffb74;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffb7c;
  ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_3a8,&local_3d8,local_420 + 2,&local_460,ListReduceBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffb88,in_stack_fffffffffffffb90);
  LogicalType::~LogicalType(&local_3c0);
  if (local_460.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_460.super__Function_base._M_manager)
              ((_Any_data *)&local_460,(_Any_data *)&local_460,__destroy_functor);
  }
  LogicalType::~LogicalType(local_420 + 2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3d8);
  lVar3 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_420[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  LogicalType::~LogicalType(&local_438);
  FStack_2ff = SPECIAL_HANDLING;
  local_2a0 = ListLambdaBindData::Serialize;
  local_298 = ListLambdaBindData::Deserialize;
  local_2b8 = ListReduceBindLambda;
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_280,(SimpleFunction *)local_3a8);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_0243ff60;
  LogicalType::LogicalType(&local_280.super_BaseScalarFunction.return_type,&LStack_318);
  local_280.super_BaseScalarFunction.stability = local_300;
  local_280.super_BaseScalarFunction.null_handling = FStack_2ff;
  local_280.super_BaseScalarFunction.errors = FStack_2fe;
  local_280.super_BaseScalarFunction.collation_handling = FStack_2fd;
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  psVar1 = &local_280.function;
  local_440 = &_Stack_2f8;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)local_440);
  puVar4 = auStack_2d8;
  pp_Var5 = &local_280.bind;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pp_Var5 = (bind_scalar_function_t)*puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    pp_Var5 = pp_Var5 + (ulong)bVar6 * -2 + 1;
  }
  local_280.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_290;
  local_280.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_288._M_pi;
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
    }
  }
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  LogicalType::LogicalType(local_420,ANY);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_3a8 + 0x48)
             ,local_420);
  LogicalType::~LogicalType(local_420);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_158,(SimpleFunction *)local_3a8);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_0243ff60;
  LogicalType::LogicalType(&local_158.super_BaseScalarFunction.return_type,&LStack_318);
  p_Var2 = local_440;
  psVar1 = &local_158.function;
  local_158.super_BaseScalarFunction.stability = local_300;
  local_158.super_BaseScalarFunction.null_handling = FStack_2ff;
  local_158.super_BaseScalarFunction.errors = FStack_2fe;
  local_158.super_BaseScalarFunction.collation_handling = FStack_2fd;
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)local_440);
  puVar4 = auStack_2d8;
  pp_Var5 = &local_158.bind;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pp_Var5 = (bind_scalar_function_t)*puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    pp_Var5 = pp_Var5 + (ulong)bVar6 * -2 + 1;
  }
  local_158.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_290;
  local_158.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_288._M_pi;
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  local_3a8._0_8_ = &PTR__ScalarFunction_02433f30;
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
  }
  if (local_2e8 != (_Manager_type)0x0) {
    (*local_2e8)(p_Var2,p_Var2,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3a8);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ListReduceFun::GetFunctions() {
	ScalarFunction fun({LogicalType::LIST(LogicalType::ANY), LogicalType::LAMBDA}, LogicalType::ANY,
	                   LambdaFunctions::ListReduceFunction, ListReduceBind, nullptr, nullptr);

	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.serialize = ListLambdaBindData::Serialize;
	fun.deserialize = ListLambdaBindData::Deserialize;
	fun.bind_lambda = ListReduceBindLambda;

	ScalarFunctionSet set;
	set.AddFunction(fun);
	fun.arguments.push_back(LogicalType::ANY);
	set.AddFunction(fun);
	return set;
}